

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O2

void argsman_tests::util_CheckValue_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  pointer local_710;
  pointer local_708;
  char *local_700;
  char *local_6f8;
  pointer local_6f0;
  pointer local_6e8;
  char *local_6e0;
  char *local_6d8;
  pointer local_6d0;
  pointer local_6c8;
  char *local_6c0;
  char *local_6b8;
  pointer local_6b0;
  pointer local_6a8;
  char *local_6a0;
  char *local_698;
  pointer local_690;
  pointer local_688;
  char *local_680;
  char *local_678;
  basic_wrap_stringstream<char> local_670;
  util_CheckValue t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_678 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"util_CheckValue");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_690 = (pbVar3->_M_dataplus)._M_p;
  local_688 = local_690 + pbVar3->_M_string_length;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xab;
  file.m_begin = (iterator)&local_680;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_690,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  CheckValueTest::CheckValueTest(&t.super_CheckValueTest);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_698 = "";
  memset(&local_670,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_670);
  std::operator<<((ostream *)&local_670,'\"');
  std::operator<<((ostream *)&local_670,"util_CheckValue");
  std::operator<<((ostream *)&local_670,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_670);
  local_6b0 = (pbVar3->_M_dataplus)._M_p;
  local_6a8 = local_6b0 + pbVar3->_M_string_length;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0xab;
  file_00.m_begin = (iterator)&local_6a0;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_6b0,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_670);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_6b8 = "";
  memset(&local_670,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_670);
  std::operator<<((ostream *)&local_670,'\"');
  std::operator<<((ostream *)&local_670,"util_CheckValue");
  std::operator<<((ostream *)&local_670,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_670);
  local_6d0 = (pbVar3->_M_dataplus)._M_p;
  local_6c8 = local_6d0 + pbVar3->_M_string_length;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  file_01.m_end = (iterator)0xab;
  file_01.m_begin = (iterator)&local_6c0;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_6d0,msg_01);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_670);
  util_CheckValue::test_method(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_6d8 = "";
  memset(&local_670,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_670);
  std::operator<<((ostream *)&local_670,'\"');
  std::operator<<((ostream *)&local_670,"util_CheckValue");
  std::operator<<((ostream *)&local_670,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_670);
  local_6f0 = (pbVar3->_M_dataplus)._M_p;
  local_6e8 = local_6f0 + pbVar3->_M_string_length;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  file_02.m_end = (iterator)0xab;
  file_02.m_begin = (iterator)&local_6e0;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_6f0,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_670);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_700 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_6f8 = "";
  memset(&local_670,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_670);
  std::operator<<((ostream *)&local_670,'\"');
  std::operator<<((ostream *)&local_670,"util_CheckValue");
  std::operator<<((ostream *)&local_670,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_670);
  local_710 = (pbVar3->_M_dataplus)._M_p;
  local_708 = local_710 + pbVar3->_M_string_length;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  file_03.m_end = (iterator)0xab;
  file_03.m_begin = (iterator)&local_700;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_710,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_670);
  TestChain100Setup::~TestChain100Setup((TestChain100Setup *)&t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(util_CheckValue, CheckValueTest)
{
    using M = ArgsManager;

    CheckValue(M::ALLOW_ANY, nullptr, Expect{{}}.DefaultString().DefaultInt().DefaultBool().List({}));
    CheckValue(M::ALLOW_ANY, "-novalue", Expect{false}.String("0").Int(0).Bool(false).List({}));
    CheckValue(M::ALLOW_ANY, "-novalue=", Expect{false}.String("0").Int(0).Bool(false).List({}));
    CheckValue(M::ALLOW_ANY, "-novalue=0", Expect{true}.String("1").Int(1).Bool(true).List({"1"}));
    CheckValue(M::ALLOW_ANY, "-novalue=1", Expect{false}.String("0").Int(0).Bool(false).List({}));
    CheckValue(M::ALLOW_ANY, "-novalue=2", Expect{false}.String("0").Int(0).Bool(false).List({}));
    CheckValue(M::ALLOW_ANY, "-novalue=abc", Expect{true}.String("1").Int(1).Bool(true).List({"1"}));
    CheckValue(M::ALLOW_ANY, "-value", Expect{""}.String("").Int(0).Bool(true).List({""}));
    CheckValue(M::ALLOW_ANY, "-value=", Expect{""}.String("").Int(0).Bool(true).List({""}));
    CheckValue(M::ALLOW_ANY, "-value=0", Expect{"0"}.String("0").Int(0).Bool(false).List({"0"}));
    CheckValue(M::ALLOW_ANY, "-value=1", Expect{"1"}.String("1").Int(1).Bool(true).List({"1"}));
    CheckValue(M::ALLOW_ANY, "-value=2", Expect{"2"}.String("2").Int(2).Bool(true).List({"2"}));
    CheckValue(M::ALLOW_ANY, "-value=abc", Expect{"abc"}.String("abc").Int(0).Bool(false).List({"abc"}));
}